

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::IsJsNativeType(TypeId type)

{
  BOOL local_c;
  TypeId type_local;
  
  switch(type) {
  case TypeIds_Symbol:
  case TypeIds_Proxy:
  case TypeIds_Function:
  case TypeIds_Object:
  case TypeIds_Array:
  case TypeIds_NativeIntArray:
  case TypeIds_CopyOnAccessNativeIntArray:
  case TypeIds_ArrayLast:
  case TypeIds_ArrayLastWithES5:
  case TypeIds_Date:
  case TypeIds_RegEx:
  case TypeIds_Error:
  case TypeIds_BooleanObject:
  case TypeIds_NumberObject:
  case TypeIds_StringObject:
  case TypeIds_Arguments:
  case TypeIds_Map:
  case TypeIds_Set:
  case TypeIds_WeakMap:
  case TypeIds_WeakSet:
  case TypeIds_SymbolObject:
  case TypeIds_ArrayIterator:
  case TypeIds_MapIterator:
  case TypeIds_SetIterator:
  case TypeIds_StringIterator:
  case TypeIds_Generator:
  case TypeIds_AsyncGenerator:
  case TypeIds_AsyncFromSyncIterator:
  case TypeIds_Promise:
  case TypeIds_ActivationObject:
    local_c = 1;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

BOOL JavascriptOperators::IsJsNativeType(TypeId type)
    {
        switch(type)
        {
            case TypeIds_Object:
            case TypeIds_Function:
            case TypeIds_Array:
            case TypeIds_NativeIntArray:
#if ENABLE_COPYONACCESS_ARRAY
            case TypeIds_CopyOnAccessNativeIntArray:
#endif
            case TypeIds_NativeFloatArray:
            case TypeIds_ES5Array:
            case TypeIds_Date:
            case TypeIds_RegEx:
            case TypeIds_Error:
            case TypeIds_BooleanObject:
            case TypeIds_NumberObject:
            case TypeIds_StringObject:
            case TypeIds_Symbol:
            case TypeIds_SymbolObject:
            //case TypeIds_GlobalObject:
            //case TypeIds_ModuleRoot:
            //case TypeIds_HostObject:
            case TypeIds_Arguments:
            case TypeIds_ActivationObject:
            case TypeIds_Map:
            case TypeIds_Set:
            case TypeIds_WeakMap:
            case TypeIds_WeakSet:
            case TypeIds_ArrayIterator:
            case TypeIds_MapIterator:
            case TypeIds_SetIterator:
            case TypeIds_StringIterator:
            case TypeIds_Generator:
            case TypeIds_AsyncGenerator:
            case TypeIds_AsyncFromSyncIterator:
            case TypeIds_Promise:
            case TypeIds_Proxy:
                return true;
            default:
                return false;
        }
    }